

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4799b::BuildSystemTaskTests_staleFileRemoval_Test::
~BuildSystemTaskTests_staleFileRemoval_Test(BuildSystemTaskTests_staleFileRemoval_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BuildSystemTaskTests, staleFileRemoval) {
  TmpDir tempDir(__func__);

  SmallString<256> manifest{ tempDir.str() };
  sys::path::append(manifest, "manifest.llbuild");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      description: STALE-FILE-REMOVAL
      expectedOutputs: ["a.out"]
)END";
  }

  auto keyToBuild = BuildKey::makeCommand("C.1");

  SmallString<256> builddb{ tempDir.str() };
  sys::path::append(builddb, "build.db");

  {
    MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
    BuildSystem system(delegate, createLocalFileSystem());
    system.attachDB(builddb.c_str(), nullptr);

    bool loadingResult = system.loadDescription(manifest);
    ASSERT_TRUE(loadingResult);

    auto result = system.build(keyToBuild);

    ASSERT_TRUE(result.hasValue());
    ASSERT_TRUE(result.getValue().isStaleFileRemoval());
    ASSERT_EQ(result.getValue().getStaleFileList().size(), 1UL);
    ASSERT_TRUE(strcmp(result.getValue().getStaleFileList()[0].str().c_str(), "a.out") == 0);

    ASSERT_EQ(std::vector<std::string>({
      "commandPreparing(C.1)",
      "commandStarted(C.1)",
      "commandFinished(C.1: 0)",
    }), delegate.getMessages());
  }

  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
  C.1:
    tool: stale-file-removal
    description: STALE-FILE-REMOVAL
    expectedOutputs: ["b.out"]
)END";
  }

  auto mockFS = std::make_shared<LoggingFileSystem>();
  std::unique_ptr<FileSystem> wrapFS(new FileSystemReferenceWrapper(*mockFS));
  MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
  BuildSystem system(delegate, std::move(wrapFS));
  system.attachDB(builddb.c_str(), nullptr);
  bool loadingResult = system.loadDescription(manifest);
  ASSERT_TRUE(loadingResult);
  auto result = system.build(keyToBuild);

  ASSERT_TRUE(result.hasValue());
  ASSERT_TRUE(result.getValue().isStaleFileRemoval());
  ASSERT_EQ(result.getValue().getStaleFileList().size(), 1UL);
  ASSERT_TRUE(strcmp(result.getValue().getStaleFileList()[0].str().c_str(), "b.out") == 0);

  ASSERT_EQ(std::vector<std::string>({ "a.out" }), mockFS->getDeletedPaths());

  ASSERT_EQ(std::vector<std::string>({
    "commandPreparing(C.1)",
    "commandStarted(C.1)",
    "commandNote(C.1) Removed stale file 'a.out'\n",
    "commandFinished(C.1: 0)",
  }), delegate.getMessages());
}